

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::StdPropertyExtract_StaticType(SnapObject *snpObject,RecyclableObject *obj)

{
  snpObject->OptIndexedObjectArray = 0;
  snpObject->OptDependsOnInfo = (DependsOnInfo *)0x0;
  snpObject->IsCrossSite = 0;
  snpObject->VarArrayCount = 0;
  snpObject->VarArray = (TTDVar *)0x0;
  return;
}

Assistant:

void StdPropertyExtract_StaticType(SnapObject* snpObject, Js::RecyclableObject* obj)
        {
            snpObject->IsCrossSite = FALSE;

            snpObject->VarArrayCount = 0;
            snpObject->VarArray = nullptr;

            snpObject->OptIndexedObjectArray = TTD_INVALID_PTR_ID;

            snpObject->OptDependsOnInfo = nullptr;
            //AddtlSnapObjectInfo must be set later in type specific extract code
        }